

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cryptor.cpp
# Opt level: O2

unique_ptr<Cryptor,_std::default_delete<Cryptor>_>
Cryptor::cryptor_factory(string *mode,string *type,string *message)

{
  bool bVar1;
  bool bVar2;
  runtime_error *prVar3;
  string *psStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> msg;
  
  bVar1 = std::operator==(type,"-e");
  if ((!bVar1) && (bVar2 = std::operator==(type,"-d"), !bVar2)) {
    std::operator+(&msg,"Not possible mode: ",type);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,msg._M_dataplus._M_p);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar2 = std::operator==(message,"Huffman");
  psStack_50 = (string *)0x0;
  if (!bVar2) {
    bVar2 = std::operator==(message,"Lz77");
    if (bVar2) {
      psStack_50 = (string *)0x1;
    }
    else {
      bVar2 = std::operator==(message,"Deflate");
      if (!bVar2) {
        std::operator+(&msg,"Not possible type: ",message);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,msg._M_dataplus._M_p);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      psStack_50 = (string *)0x2;
    }
  }
  cryptor_factory(SUB81(mode,0),(uint)bVar1,psStack_50);
  return (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)
         (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)mode;
}

Assistant:

std::unique_ptr<Cryptor> Cryptor::cryptor_factory(
  const std::string& mode,
  const std::string& type,
  const std::string& message)
{
  bool b_mode;
  Cryptors c_type;

  if (mode == ENCRYPT_KEY) {
    b_mode = true;
  }
  else if (mode == DECRYPT_KEY) {
    b_mode = false;
  }
  else {
    const auto msg = "Not possible mode: " + mode;
    throw runtime_error(msg.c_str());
  }

  if (type == HUFFMAN_KEY) {
    c_type = Cryptors::Huffman;
  }
  else if (type == LZ77_KEY) {
    c_type = Cryptors::Lz77;
  }
  else if (type == DEFLATE_KEY) {
    c_type = Cryptors::Deflate;
  }
  else {
    const auto msg = "Not possible type: " + type;
    throw runtime_error(msg.c_str());
  }

  return cryptor_factory(b_mode, c_type, message);
}